

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_Triloop37(char **content,size_t *line_no)

{
  size_t sVar1;
  int iVar2;
  bool local_29;
  char *buf;
  int r;
  int i;
  size_t *line_no_local;
  char **content_local;
  
  buf._4_4_ = 0;
  memset(Triloops,0,0xf1);
  memset(Triloop37,0,0xa0);
  memset(TriloopdH,0,0xa0);
  do {
    sVar1 = *line_no;
    *line_no = sVar1 + 1;
    if (content[sVar1] == (char *)0x0) {
      return;
    }
    iVar2 = __isoc99_sscanf(content[sVar1],"%5s %d %d",Triloops + buf._4_4_ * 6,
                            Triloop37 + buf._4_4_,TriloopdH + buf._4_4_);
    strcat(Triloops," ");
    buf._4_4_ = buf._4_4_ + 1;
    local_29 = iVar2 == 3 && buf._4_4_ < 0x28;
  } while (local_29);
  return;
}

Assistant:

PRIVATE void
rd_Triloop37(char   **content,
             size_t *line_no)
{
  int   i, r;
  char  *buf;

  i = 0;
  /* erase old hexaloop entries */
  memset(&Triloops, 0, 241);
  memset(&Triloop37, 0, sizeof(int) * 40);
  memset(&TriloopdH, 0, sizeof(int) * 40);
  do {
    buf = content[(*line_no)++];
    if (buf == NULL)
      break;

    r = sscanf(buf, "%5s %d %d", &Triloops[6 * i], &Triloop37[i], &TriloopdH[i]);
    strcat(Triloops, " ");
    i++;
  } while ((r == 3) && (i < 40));
  return;
}